

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_md.c
# Opt level: O0

int md_free(BIO *a)

{
  BIO *in_RDI;
  undefined4 local_4;
  
  if (in_RDI != (BIO *)0x0) {
    BIO_get_data(in_RDI);
    EVP_MD_CTX_free((EVP_MD_CTX *)0x4162bd);
    BIO_set_data(in_RDI,(void *)0x0);
    BIO_set_init(in_RDI,0);
  }
  local_4 = (uint)(in_RDI != (BIO *)0x0);
  return local_4;
}

Assistant:

static int md_free(BIO *a)
{
    if (a == NULL)
        return 0;
    EVP_MD_CTX_free(BIO_get_data(a));
    BIO_set_data(a, NULL);
    BIO_set_init(a, 0);

    return 1;
}